

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::anon_unknown_6::LineBuffer::LineBuffer(LineBuffer *this)

{
  Format FVar1;
  Compressor *in_RDI;
  
  in_RDI->_vptr_Compressor = (_func_int **)0x0;
  in_RDI->_header = (Header *)0x0;
  in_RDI[1]._vptr_Compressor = (_func_int **)0x0;
  in_RDI[2]._header = (Header *)0x0;
  FVar1 = defaultFormat(in_RDI);
  *(Format *)&in_RDI[3]._vptr_Compressor = FVar1;
  *(undefined4 *)((long)&in_RDI[3]._vptr_Compressor + 4) = 0xffffffff;
  *(undefined1 *)&in_RDI[3]._header = 0;
  std::__cxx11::string::string((string *)(in_RDI + 4));
  IlmThread_2_5::Semaphore::Semaphore((Semaphore *)(in_RDI + 6),1);
  return;
}

Assistant:

LineBuffer::LineBuffer ():
    uncompressedData (0),
    buffer (0),
    packedDataSize (0),
    compressor (0),
    format (defaultFormat(compressor)),
    number (-1),
    hasException (false),
    exception (),
    _sem (1)
{
    // empty
}